

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O1

void run_word<wchar_t>(string *original,int *none,int *num,int *word,int *kana,int *ideo,locale *l,
                      boundary_type b)

{
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  end;
  _List_node_base *p_Var1;
  _List_iterator<wchar_t> begin;
  _List_node_base *p_Var2;
  string *psVar3;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  begin_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> pos;
  list<wchar_t,_std::allocator<wchar_t>_> lst;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> test_string;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  chunks;
  allocator_type local_109;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_e8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c8;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_a8;
  long local_a0;
  wchar_t local_98 [4];
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_88;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  locale local_48 [8];
  locale local_40 [8];
  locale local_38 [8];
  
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_a8._M_current = local_98;
  local_a0 = 0;
  local_98[0] = L'\0';
  local_68 = num;
  local_60 = word;
  local_58 = kana;
  local_50 = ideo;
  if (original->_M_string_length != 0) {
    lVar8 = 0;
    do {
      std::locale::locale(local_38,l);
      to_correct_string<wchar_t>(&local_c8,original,local_38);
      std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
      emplace_back<std::__cxx11::wstring>
                ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&local_88,
                 &local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p) !=
          &local_c8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p));
      }
      std::locale::~locale(local_38);
      std::__cxx11::wstring::_M_append
                ((wchar_t *)&local_a8,
                 (ulong)local_88.
                        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p);
      local_c8._M_dataplus._M_p._0_4_ = (int)local_a0;
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_c8);
      }
      else {
        *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (int)local_a0;
        local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar4 = 0;
      uVar5 = 0;
      if (none != (int *)0x0) {
        uVar5 = *(int *)((long)none + lVar8) * 0xf;
      }
      if (local_68 != (int *)0x0) {
        uVar4 = *(int *)((long)local_68 + lVar8) * 0xf0;
      }
      uVar7 = 0;
      uVar6 = 0;
      if (local_60 != (int *)0x0) {
        uVar6 = *(int *)((long)local_60 + lVar8) * 0xf00;
      }
      if (local_58 != (int *)0x0) {
        uVar7 = *(int *)((long)local_58 + lVar8) * 0xf000;
      }
      if (local_50 == (int *)0x0) {
        local_c8._M_dataplus._M_p._0_4_ = 0;
      }
      else {
        local_c8._M_dataplus._M_p._0_4_ = *(int *)((long)local_50 + lVar8) * 0xf0000;
      }
      local_c8._M_dataplus._M_p._0_4_ =
           uVar4 | uVar5 | uVar6 | uVar7 | (uint)local_c8._M_dataplus._M_p;
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_108,
                   (iterator)
                   local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_c8);
      }
      else {
        *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (uint)local_c8._M_dataplus._M_p;
        local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar8 = lVar8 + 4;
      psVar3 = original + 1;
      original = original + 1;
    } while (psVar3->_M_string_length != 0);
  }
  std::__cxx11::list<wchar_t,std::allocator<wchar_t>>::
  list<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
            ((list<wchar_t,std::allocator<wchar_t>> *)&local_c8,local_a8,
             (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )(local_a8._M_current + local_a0),&local_109);
  begin._M_node._4_4_ = local_c8._M_dataplus._M_p._4_4_;
  begin._M_node._0_4_ = (uint)local_c8._M_dataplus._M_p;
  std::locale::locale(local_40,l);
  test_word_container<wchar_t,std::_List_iterator<wchar_t>>
            (begin,(_List_node_base *)&local_c8,&local_e8,&local_108,&local_88,local_40,b);
  std::locale::~locale(local_40);
  begin_00._M_current = local_a8._M_current;
  end._M_current = local_a8._M_current + local_a0;
  std::locale::locale(local_48,l);
  test_word_container<wchar_t,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
            (begin_00,end,&local_e8,&local_108,&local_88,local_48,b);
  std::locale::~locale(local_48);
  p_Var2 = (_List_node_base *)
           CONCAT44(local_c8._M_dataplus._M_p._4_4_,(uint)local_c8._M_dataplus._M_p);
  while (p_Var2 != (_List_node_base *)&local_c8) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  if (local_a8._M_current != local_98) {
    operator_delete(local_a8._M_current);
  }
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_88);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run_word(std::string *original,int *none,int *num,int *word,int *kana,int *ideo,std::locale l,lb::boundary_type b=lb::word)
{
    std::vector<int> pos;
    std::vector<std::basic_string<Char> > chunks;
    std::vector<int> masks;
    std::basic_string<Char> test_string;
    for(int i=0;!original[i].empty();i++) {
        chunks.push_back(to_correct_string<Char>(original[i],l));
        test_string+=chunks.back();
        pos.push_back(test_string.size());
        masks.push_back(
              ( none ? none[i]*15 : 0)
            | ( num  ? ((num[i]*15)  << 4) : 0) 
            | ( word ? ((word[i]*15) << 8) : 0) 
            | ( kana ? ((kana[i]*15) << 12) : 0)
            | ( ideo ? ((ideo[i]*15) << 16) : 0)
        );
    }

    std::list<Char> lst(test_string.begin(),test_string.end());
    test_word_container<Char>(lst.begin(),lst.end(),pos,masks,chunks,l,b);
    test_word_container<Char>(test_string.begin(),test_string.end(),pos,masks,chunks,l,b);
}